

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall hello::devide(hello *this,boundary_type type,string *str,char *name)

{
  base_iterator end;
  bool bVar1;
  ostream *poVar2;
  reference tok;
  char *in_RCX;
  base_iterator in_RDI;
  iterator p;
  ssegment_index ind;
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe98;
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  locale *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  boundary_type type_00;
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  locale local_60 [8];
  undefined8 local_58;
  undefined8 local_50;
  char *local_20;
  
  type_00 = (boundary_type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_20 = in_RCX;
  cppcms::application::response();
  poVar2 = (ostream *)cppcms::http::response::out();
  poVar2 = std::operator<<(poVar2,local_20);
  std::operator<<(poVar2,":");
  local_50 = std::__cxx11::string::begin();
  local_58 = std::__cxx11::string::end();
  cppcms::application::context();
  cppcms::http::context::locale();
  end._M_current._7_1_ = in_stack_fffffffffffffecf;
  end._M_current._0_7_ = in_stack_fffffffffffffec8;
  booster::locale::boundary::
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::segment_index(in_stack_fffffffffffffec0,type_00,in_RDI,end,in_stack_fffffffffffffeb0);
  std::locale::~locale(local_60);
  booster::locale::boundary::details::
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::segment_index_iterator(in_stack_fffffffffffffea0);
  booster::locale::boundary::
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffea0);
  booster::locale::boundary::details::
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  while( true ) {
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffea0);
    bVar1 = booster::
            iterator_facade<booster::locale::boundary::details::segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_long>
            ::operator!=((iterator_facade<booster::locale::boundary::details::segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_long>
                          *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (!bVar1) break;
    cppcms::application::response();
    poVar2 = (ostream *)cppcms::http::response::out();
    poVar2 = std::operator<<(poVar2,"|");
    tok = booster::
          iterator_facade<booster::locale::boundary::details::segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_long>
          ::operator*((iterator_facade<booster::locale::boundary::details::segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_long>
                       *)0x13e253);
    booster::locale::boundary::operator<<(poVar2,tok);
    booster::
    iterator_facade<booster::locale::boundary::details::segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_long>
    ::operator++((iterator_facade<booster::locale::boundary::details::segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_booster::bidirectional_traversal_tag,_const_booster::locale::boundary::segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_long>
                  *)in_stack_fffffffffffffea0);
  }
  cppcms::application::response();
  poVar2 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar2,"|<br>\n");
  booster::locale::boundary::
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~segment_index((segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x13e307);
  return;
}

Assistant:

void devide(cppcms::locale::boundary::boundary_type type,std::string const &str,char const *name)
	{
		response().out()<<name<<":";
		using namespace cppcms::locale::boundary;
		ssegment_index ind(type,str.begin(),str.end(),context().locale());

		ssegment_index::iterator p;

		for(p=ind.begin();p!=ind.end();++p) {
			response().out()<<"|"<<*p;
		}
		response().out()<<"|<br>\n";
	}